

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::NextBuffer
          (EpsCopyInputStream *this,int overrun,int depth)

{
  undefined8 uVar1;
  bool bVar2;
  LogMessage *pLVar3;
  LogFinisher local_ba;
  byte local_b9;
  LogMessage local_b8;
  char *local_80;
  void *data;
  char *res;
  byte local_59;
  LogMessage local_58;
  int local_20;
  int local_1c;
  int depth_local;
  int overrun_local;
  EpsCopyInputStream *this_local;
  
  if (this->next_chunk_ == (char *)0x0) {
    this_local = (EpsCopyInputStream *)0x0;
  }
  else {
    local_20 = depth;
    local_1c = overrun;
    _depth_local = this;
    if (this->next_chunk_ == this->buffer_) {
      uVar1 = *(undefined8 *)(this->buffer_end_ + 8);
      *(undefined8 *)this->buffer_ = *(undefined8 *)this->buffer_end_;
      *(undefined8 *)(this->buffer_ + 8) = uVar1;
      if ((0 < this->overall_limit_) &&
         ((depth < 0 ||
          (bVar2 = anon_unknown_50::ParseEndsInSlopRegion(this->buffer_,overrun,depth), !bVar2)))) {
        while (bVar2 = StreamNext(this,&local_80), bVar2) {
          if (0x10 < this->size_) {
            *(undefined8 *)(this->buffer_ + 0x10) = *(undefined8 *)local_80;
            *(undefined8 *)(this->buffer_ + 0x18) = *(undefined8 *)(local_80 + 8);
            this->next_chunk_ = local_80;
            this->buffer_end_ = this->buffer_ + 0x10;
            if (1 < this->aliasing_) {
              this->aliasing_ = 1;
            }
            return this->buffer_;
          }
          if (0 < this->size_) {
            memcpy(this->buffer_ + 0x10,local_80,(long)this->size_);
            this->next_chunk_ = this->buffer_;
            this->buffer_end_ = this->buffer_ + this->size_;
            if (1 < this->aliasing_) {
              this->aliasing_ = 1;
            }
            return this->buffer_;
          }
          local_b9 = 0;
          if (this->size_ != 0) {
            LogMessage::LogMessage
                      (&local_b8,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.cc"
                       ,0x89);
            local_b9 = 1;
            pLVar3 = LogMessage::operator<<(&local_b8,"CHECK failed: size_ == 0: ");
            pLVar3 = LogMessage::operator<<(pLVar3,this->size_);
            LogFinisher::operator=(&local_ba,pLVar3);
          }
          if ((local_b9 & 1) != 0) {
            LogMessage::~LogMessage(&local_b8);
          }
        }
        this->overall_limit_ = 0;
      }
      if (this->aliasing_ == 2) {
        this->aliasing_ = (long)this->buffer_end_ - (long)this->buffer_;
      }
      this->next_chunk_ = (char *)0x0;
      this->buffer_end_ = this->buffer_ + 0x10;
      this->size_ = 0;
      this_local = (EpsCopyInputStream *)this->buffer_;
    }
    else {
      local_59 = 0;
      if (this->size_ < 0x11) {
        LogMessage::LogMessage
                  (&local_58,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.cc"
                   ,0x69);
        local_59 = 1;
        pLVar3 = LogMessage::operator<<(&local_58,"CHECK failed: size_ > kSlopBytes: ");
        LogFinisher::operator=((LogFinisher *)((long)&res + 3),pLVar3);
      }
      if ((local_59 & 1) != 0) {
        LogMessage::~LogMessage(&local_58);
      }
      this->buffer_end_ = this->next_chunk_ + (long)this->size_ + -0x10;
      this_local = (EpsCopyInputStream *)this->next_chunk_;
      this->next_chunk_ = this->buffer_;
      if (this->aliasing_ == 1) {
        this->aliasing_ = 2;
      }
    }
  }
  return (char *)this_local;
}

Assistant:

const char* EpsCopyInputStream::NextBuffer(int overrun, int depth) {
  if (next_chunk_ == nullptr) return nullptr;  // We've reached end of stream.
  if (next_chunk_ != buffer_) {
    GOOGLE_DCHECK(size_ > kSlopBytes);
    // The chunk is large enough to be used directly
    buffer_end_ = next_chunk_ + size_ - kSlopBytes;
    auto res = next_chunk_;
    next_chunk_ = buffer_;
    if (aliasing_ == kOnPatch) aliasing_ = kNoDelta;
    return res;
  }
  // Move the slop bytes of previous buffer to start of the patch buffer.
  // Note we must use memmove because the previous buffer could be part of
  // buffer_.
  std::memmove(buffer_, buffer_end_, kSlopBytes);
  if (overall_limit_ > 0 &&
      (depth < 0 || !ParseEndsInSlopRegion(buffer_, overrun, depth))) {
    const void* data;
    // ZeroCopyInputStream indicates Next may return 0 size buffers. Hence
    // we loop.
    while (StreamNext(&data)) {
      if (size_ > kSlopBytes) {
        // We got a large chunk
        std::memcpy(buffer_ + kSlopBytes, data, kSlopBytes);
        next_chunk_ = static_cast<const char*>(data);
        buffer_end_ = buffer_ + kSlopBytes;
        if (aliasing_ >= kNoDelta) aliasing_ = kOnPatch;
        return buffer_;
      } else if (size_ > 0) {
        std::memcpy(buffer_ + kSlopBytes, data, size_);
        next_chunk_ = buffer_;
        buffer_end_ = buffer_ + size_;
        if (aliasing_ >= kNoDelta) aliasing_ = kOnPatch;
        return buffer_;
      }
      GOOGLE_DCHECK(size_ == 0) << size_;
    }
    overall_limit_ = 0;  // Next failed, no more needs for next
  }
  // End of stream or array
  if (aliasing_ == kNoDelta) {
    // If there is no more block and aliasing is true, the previous block
    // is still valid and we can alias. We have users relying on string_view's
    // obtained from protos to outlive the proto, when the parse was from an
    // array. This guarantees string_view's are always aliased if parsed from
    // an array.
    aliasing_ = reinterpret_cast<std::uintptr_t>(buffer_end_) -
                reinterpret_cast<std::uintptr_t>(buffer_);
  }
  next_chunk_ = nullptr;
  buffer_end_ = buffer_ + kSlopBytes;
  size_ = 0;
  return buffer_;
}